

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopClipRect(void)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  ImDrawList::PopClipRect(pIVar2->DrawList);
  lVar6 = (long)(pIVar2->DrawList->_ClipRectStack).Size;
  if (0 < lVar6) {
    pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data + lVar6 + -1;
    fVar3 = pIVar1->y;
    fVar4 = pIVar1->z;
    fVar5 = pIVar1->w;
    (pIVar2->ClipRect).Min.x = pIVar1->x;
    (pIVar2->ClipRect).Min.y = fVar3;
    (pIVar2->ClipRect).Max.x = fVar4;
    (pIVar2->ClipRect).Max.y = fVar5;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x4f0,"T &ImVector<ImVec4>::back() [T = ImVec4]");
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c < 0x10000)    // FIXME: Losing characters that don't fit in 2 bytes
            *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}